

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_parse_ext_op(lysc_ext_instance *ext,lyd_node *parent,ly_in *in,LYD_FORMAT format,
                       lyd_type data_type,lyd_node **tree,lyd_node **op)

{
  ly_ctx *ctx_00;
  ly_ctx *ctx;
  lyd_node **tree_local;
  lyd_type data_type_local;
  LYD_FORMAT format_local;
  ly_in *in_local;
  lyd_node *parent_local;
  lysc_ext_instance *ext_local;
  
  if (ext == (lysc_ext_instance *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ext","lyd_parse_ext_op");
    ext_local._4_4_ = LY_EINVAL;
  }
  else {
    ctx_00 = ext->module->ctx;
    if (in == (ly_in *)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","lyd_parse_ext_op");
      ext_local._4_4_ = LY_EINVAL;
    }
    else if (data_type == LYD_TYPE_DATA_YANG) {
      ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","data_type","lyd_parse_ext_op")
      ;
      ext_local._4_4_ = LY_EINVAL;
    }
    else if (((parent == (lyd_node *)0x0) && (tree == (lyd_node **)0x0)) && (op == (lyd_node **)0x0)
            ) {
      ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || tree || op",
             "lyd_parse_ext_op");
      ext_local._4_4_ = LY_EINVAL;
    }
    else {
      ext_local._4_4_ = lyd_parse_op_(ctx_00,ext,parent,in,format,data_type,tree,op);
    }
  }
  return ext_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_parse_ext_op(const struct lysc_ext_instance *ext, struct lyd_node *parent, struct ly_in *in, LYD_FORMAT format,
        enum lyd_type data_type, struct lyd_node **tree, struct lyd_node **op)
{
    const struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;

    LY_CHECK_ARG_RET(ctx, ext, in, data_type, parent || tree || op, LY_EINVAL);

    return lyd_parse_op_(ctx, ext, parent, in, format, data_type, tree, op);
}